

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void jump(ch_context *context,ch_jmpptr offset)

{
  uint8_t *puVar1;
  uint8_t *jump_ptr;
  ch_jmpptr offset_local;
  ch_context *context_local;
  
  puVar1 = context->pcurrent + offset;
  if ((puVar1 < context->pstart) || (context->pend <= puVar1)) {
    ch_runtime_error(context,EXIT_INVALID_INSTRUCTION_POINTER,
                     "Jump pointer exceeds bounds of program.");
  }
  else {
    context->pcurrent = puVar1;
  }
  return;
}

Assistant:

static void jump(ch_context *context, ch_jmpptr offset) {
  uint8_t *jump_ptr = context->pcurrent + offset;
  if (!IS_PROGRAM_PTR_SAFE(context, jump_ptr)) {
    ch_runtime_error(context, EXIT_INVALID_INSTRUCTION_POINTER,
                     "Jump pointer exceeds bounds of program.");
    return;
  }

  context->pcurrent = jump_ptr;
}